

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Curve::writeTo(Curve *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  affine3f *in_RDI;
  BinaryWriter *in_stack_00000048;
  Shape *in_stack_00000050;
  
  Shape::writeTo(in_stack_00000050,in_stack_00000048);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<pbrt::Curve::BasisType>(in_RSI,(BasisType *)in_RDI);
  BinaryWriter::write<pbrt::Curve::CurveType>(in_RSI,(CurveType *)in_RDI);
  BinaryWriter::write<unsigned_char>(in_RSI,(uchar *)in_RDI);
  BinaryWriter::write<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>,void>
            ((BinaryWriter *)this,
             (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)binary);
  BinaryWriter::write<pbrt::math::affine3f>(in_RSI,in_RDI);
  return 0x36;
}

Assistant:

int Curve::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(width0);
    binary.write(width1);
    binary.write(basis);
    binary.write(type);
    binary.write(degree);
    binary.write(P);
    binary.write(transform);
    return TYPE_CURVE;
  }